

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t xx_cvtsi128_si64(__m128i a)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  __m128i a_local;
  
  return CONCAT44(in_XMM0_Db,in_XMM0_Da);
}

Assistant:

static inline uint64_t xx_cvtsi128_si64(__m128i a) {
#if AOM_ARCH_X86_64
  return (uint64_t)_mm_cvtsi128_si64(a);
#else
  {
    uint64_t tmp;
    _mm_storel_epi64((__m128i *)&tmp, a);
    return tmp;
  }
#endif
}